

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

shared_ptr<slang::syntax::SyntaxTree> __thiscall
slang::syntax::SyntaxRewriter<TestRewriter>::transform
          (SyntaxRewriter<TestRewriter> *this,shared_ptr<slang::syntax::SyntaxTree> *tree,
          SourceLibrary *library)

{
  ChangeCollection *this_00;
  bool bVar1;
  SourceLibrary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<slang::syntax::SyntaxTree> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  tree[1].super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           ((library->name)._M_dataplus._M_p + 0x18);
  this_00 = (ChangeCollection *)(tree + 2);
  detail::ChangeCollection::clear(this_00);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::clear((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           *)(tree + 0x11));
  detail::visitSyntaxNode<slang::syntax::SyntaxNode,TestRewriter>
            (*(SyntaxNode **)((library->name)._M_dataplus._M_p + 8),(TestRewriter *)tree);
  bVar1 = detail::ChangeCollection::empty(this_00);
  if (bVar1) {
    std::__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)library);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    sVar3 = detail::transformTree
                      ((detail *)this,(BumpAllocator *)tree,
                       (shared_ptr<slang::syntax::SyntaxTree> *)library,this_00,
                       (vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                        *)(tree + 0x11),in_RCX);
    _Var2 = sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar3.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> transform(const std::shared_ptr<SyntaxTree>& tree,
                                          const SourceLibrary* library = nullptr) {
        sourceManager = &tree->sourceManager();
        commits.clear();
        tempTrees.clear();

        tree->root().visit(*DERIVED);

        if (commits.empty())
            return tree;

        return transformTree(std::move(alloc), tree, commits, tempTrees, library);
    }